

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O2

void __thiscall kws::Generator::Generator(Generator *this)

{
  (this->m_ProjectTitle)._M_dataplus._M_p = (pointer)&(this->m_ProjectTitle).field_2;
  (this->m_ProjectTitle)._M_string_length = 0;
  (this->m_ProjectTitle).field_2._M_local_buf[0] = '\0';
  (this->m_ProjectLogo)._M_dataplus._M_p = (pointer)&(this->m_ProjectLogo).field_2;
  (this->m_ProjectLogo)._M_string_length = 0;
  (this->m_ProjectLogo).field_2._M_local_buf[0] = '\0';
  (this->m_KWStyleLogo)._M_dataplus._M_p = (pointer)&(this->m_KWStyleLogo).field_2;
  (this->m_KWStyleLogo)._M_string_length = 0;
  (this->m_KWStyleLogo).field_2._M_local_buf[0] = '\0';
  this->m_Parsers = (ParserVectorType *)0x0;
  std::__cxx11::string::assign((char *)&this->m_ProjectTitle);
  std::__cxx11::string::assign((char *)&this->m_ProjectLogo);
  std::__cxx11::string::assign((char *)&this->m_KWStyleLogo);
  this->m_MaxDirectoryDepth = 99;
  this->m_ErrorThreshold = 0;
  return;
}

Assistant:

Generator::Generator()
{
  m_Parsers = nullptr;
  m_ProjectTitle = "";
  m_ProjectLogo = "Logo.gif";
  m_KWStyleLogo = "kwstylelogo.jpg";
  m_MaxDirectoryDepth = 99;
  m_ErrorThreshold = 0;
}